

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O2

uint16 CalcCRCSBG(void *pBuffer,uint16 bufferSize)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  undefined6 in_register_00000032;
  uint uVar5;
  bool bVar6;
  
  uVar2 = 0;
  for (uVar3 = 0; uVar3 != (CONCAT62(in_register_00000032,bufferSize) & 0xffffffff);
      uVar3 = uVar3 + 1) {
    cVar4 = '\b';
    uVar2 = uVar2 ^ *(byte *)((long)pBuffer + uVar3);
    while (bVar6 = cVar4 != '\0', cVar4 = cVar4 + -1, bVar6) {
      uVar5 = (uVar2 & 0xffff) >> 1;
      uVar1 = uVar2 & 1;
      uVar2 = uVar5 ^ 0xffff8408;
      if (uVar1 == 0) {
        uVar2 = uVar5;
      }
    }
  }
  return (uint16)uVar2;
}

Assistant:

inline uint16 CalcCRCSBG(const void *pBuffer, uint16 bufferSize)
{
	const uint8 *pBytesArray = (const uint8*)pBuffer;
	uint16 poly = 0x8408;
	uint16 crc = 0;
	uint8 carry;
	uint8 i_bits;
	uint16 j;
	for (j =0; j < bufferSize; j++)
	{
		crc = crc ^ pBytesArray[j];
		for (i_bits = 0; i_bits < 8; i_bits++)
		{
			carry = crc & 1;
			crc = crc / 2;
			if (carry)
			{
				crc = crc^poly;
			}
		}
	}
	return crc;
}